

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::StartGroup(XmlReporter *this,string *groupName)

{
  XmlWriter *this_00;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *groupName_local;
  XmlReporter *this_local;
  
  local_18 = groupName;
  groupName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Group",&local_39);
  this_00 = XmlWriter::startElement(&this->m_xml,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"name",&local_71);
  XmlWriter::writeAttribute(this_00,(string *)local_70,local_18);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupName );
        }